

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_long_Test<unsigned_char>::TestBody
          (SplitCompilationTest_empty_long_Test<unsigned_char> *this)

{
  pointer *__ptr;
  __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  in_R9;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> delim
  ;
  AssertHelper local_70 [8];
  long *local_68;
  byte local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  local_20;
  
  make_delim_long<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_30,8,'\0');
  jessilib::
  split<std::vector,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_const_unsigned_char_*,_const_unsigned_char_*,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
            ((container_type *)local_50,(uchar *)0x0,(uchar *)0x0,
             (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )local_30._M_allocated_capacity,
             (uchar *)(local_30._8_8_ + local_30._M_allocated_capacity));
  local_60[0] = local_50._0_8_ == local_50._8_8_;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_50._8_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) goto LAB_00382b01;
LAB_00382a5d:
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,(char *)local_60,"split_view(empty, delim).empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x35,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)((long)(size_t *)local_50._16_8_ + 1));
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  else {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ - local_50._0_8_);
    if ((local_60[0] & 1) == 0) goto LAB_00382a5d;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
LAB_00382b01:
  jessilib::
  split_once<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>,unsigned_char_const*,unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
            ((pair<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>
              *)local_50,(jessilib *)0x0,(uchar *)0x0,(uchar *)local_30._M_allocated_capacity,
             (uchar *)(local_30._8_8_ + local_30._M_allocated_capacity),in_R9);
  local_60[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,(char *)local_60,
               "split_once_view(empty, delim).first.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x36,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)((long)(size_t *)local_50._16_8_ + 1));
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_30._M_allocated_capacity != &local_20) {
    operator_delete((void *)local_30._M_allocated_capacity,local_20._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_long) {
	// string_view w/ long delimiter
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split_view(empty, delim).empty());
	EXPECT_TRUE(split_once_view(empty, delim).first.empty());
}